

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlb_main.c
# Opt level: O0

void write_dlb_directory(int out,int nfiles,libdir *ld,long slen,long dir_size,long flen)

{
  size_t sVar1;
  int local_203c;
  char local_2038 [4];
  int i;
  char buf [8192];
  long flen_local;
  long dir_size_local;
  long slen_local;
  libdir *ld_local;
  int nfiles_local;
  int out_local;
  
  sprintf(local_2038,"%3ld %8ld %8ld %8ld %8ld\n",1,(long)nfiles + 1,slen + nfiles + 10,dir_size,
          flen + dir_size);
  sVar1 = strlen(local_2038);
  Write(out,local_2038,sVar1);
  sprintf(local_2038,"%c%s %8ld\n",0x6e,"Directory",0);
  sVar1 = strlen(local_2038);
  Write(out,local_2038,sVar1);
  for (local_203c = 0; local_203c < nfiles; local_203c = local_203c + 1) {
    sprintf(local_2038,"%c%s %8ld\n",0x6e,ld[local_203c].fname,ld[local_203c].foffset + dir_size);
    sVar1 = strlen(local_2038);
    Write(out,local_2038,sVar1);
  }
  return;
}

Assistant:

static void write_dlb_directory(int out, int nfiles, libdir *ld, long slen,
				long dir_size, long flen)
{
    char buf[BUFSIZ];
    int i;

    sprintf(buf,"%3ld %8ld %8ld %8ld %8ld\n",
	    (long) DLB_VERS,	    /* version of dlb file */
	    (long) nfiles+1,	    /* # of entries (includes directory) */
				    /* string length + room for nulls */
	    (long) slen+strlen(DLB_DIRECTORY)+nfiles+1,
	    (long) dir_size,	    /* start of first file */
	    (long) flen+dir_size);  /* total file size */
    Write(out, buf, strlen(buf));

    /* write each file entry */
#define ENTRY_FORMAT "%c%s %8ld\n"
    sprintf(buf, ENTRY_FORMAT, ENC_NORMAL, DLB_DIRECTORY, (long) 0);
    Write(out, buf, strlen(buf));
    for (i = 0; i < nfiles; i++) {
	sprintf(buf, ENTRY_FORMAT,
		ENC_NORMAL,		    /* encoding */
		ld[i].fname,		    /* name */
		ld[i].foffset + dir_size);  /* offset */
	Write(out, buf, strlen(buf));
    }
}